

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O2

void __thiscall Js::ES5Array::MarkVisitKindSpecificPtrs(ES5Array *this,SnapshotExtractor *extractor)

{
  uint uVar1;
  uint32 key;
  void *local_40;
  void *descriptorValidationToken;
  IndexPropertyDescriptor *descriptor;
  
  JavascriptArray::MarkVisitKindSpecificPtrs(&this->super_JavascriptArray,extractor);
  uVar1 = (this->super_JavascriptArray).super_ArrayObject.length;
  descriptorValidationToken = (void *)0x0;
  local_40 = (void *)0x0;
  key = 0xffffffff;
  while( true ) {
    key = GetNextDescriptor(this,key,(IndexPropertyDescriptor **)&descriptorValidationToken,
                            &local_40);
    if (uVar1 <= key) break;
    if ((*descriptorValidationToken & 8) == 0) {
      if (*(Var *)((long)descriptorValidationToken + 8) != (Var)0x0) {
        TTD::SnapshotExtractor::MarkVisitVar
                  (extractor,*(Var *)((long)descriptorValidationToken + 8));
      }
      if (*(Var *)((long)descriptorValidationToken + 0x10) != (Var)0x0) {
        TTD::SnapshotExtractor::MarkVisitVar
                  (extractor,*(Var *)((long)descriptorValidationToken + 0x10));
      }
    }
  }
  return;
}

Assistant:

void ES5Array::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        this->JavascriptArray::MarkVisitKindSpecificPtrs(extractor);

        uint32 length = this->GetLength();
        uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
        IndexPropertyDescriptor* descriptor = nullptr;
        void* descriptorValidationToken = nullptr;

        do
        {
            descriptorIndex = this->GetNextDescriptor(descriptorIndex, &descriptor, &descriptorValidationToken);
            if(descriptorIndex == Js::JavascriptArray::InvalidIndex || descriptorIndex >= length)
            {
                break;
            }

            if((descriptor->Attributes & PropertyDeleted) != PropertyDeleted)
            {
                if(descriptor->Getter != nullptr)
                {
                    extractor->MarkVisitVar(descriptor->Getter);
                }

                if(descriptor->Setter != nullptr)
                {
                    extractor->MarkVisitVar(descriptor->Setter);
                }
            }

        } while(true);
    }